

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

xmlNodeSetPtr xmlXPathNodeLeadingSorted(xmlNodeSetPtr nodes,xmlNodePtr node)

{
  int iVar1;
  int iVar2;
  xmlNodeSetPtr cur;
  xmlNodePtr val;
  long lVar3;
  
  cur = nodes;
  if (node != (xmlNodePtr)0x0) {
    cur = (xmlNodeSetPtr)(*xmlMalloc)(0x10);
    if (cur == (xmlNodeSetPtr)0x0) {
      cur = (xmlNodeSetPtr)0x0;
    }
    else {
      cur->nodeNr = 0;
      cur->nodeMax = 0;
      cur->nodeTab = (xmlNodePtr *)0x0;
    }
    if (cur == (xmlNodeSetPtr)0x0) {
LAB_001bdda1:
      cur = (xmlNodeSetPtr)0x0;
    }
    else if ((((nodes != (xmlNodeSetPtr)0x0) && (nodes->nodeNr != 0)) &&
             (nodes->nodeTab != (xmlNodePtr *)0x0)) &&
            ((iVar1 = xmlXPathNodeSetContains(nodes,node), iVar1 != 0 &&
             (iVar1 = nodes->nodeNr, 0 < (long)iVar1)))) {
      lVar3 = 0;
      do {
        if (lVar3 < nodes->nodeNr) {
          val = nodes->nodeTab[lVar3];
        }
        else {
          val = (xmlNodePtr)0x0;
        }
        if (val == node) {
          return cur;
        }
        iVar2 = xmlXPathNodeSetAddUnique(cur,val);
        if (iVar2 < 0) {
          xmlXPathFreeNodeSet(cur);
          goto LAB_001bdda1;
        }
        lVar3 = lVar3 + 1;
      } while (iVar1 != lVar3);
    }
  }
  return cur;
}

Assistant:

xmlNodeSetPtr
xmlXPathNodeLeadingSorted (xmlNodeSetPtr nodes, xmlNodePtr node) {
    int i, l;
    xmlNodePtr cur;
    xmlNodeSetPtr ret;

    if (node == NULL)
	return(nodes);

    ret = xmlXPathNodeSetCreate(NULL);
    if (ret == NULL)
        return(ret);
    if (xmlXPathNodeSetIsEmpty(nodes) ||
	(!xmlXPathNodeSetContains(nodes, node)))
	return(ret);

    l = xmlXPathNodeSetGetLength(nodes);
    for (i = 0; i < l; i++) {
	cur = xmlXPathNodeSetItem(nodes, i);
	if (cur == node)
	    break;
	if (xmlXPathNodeSetAddUnique(ret, cur) < 0) {
            xmlXPathFreeNodeSet(ret);
	    return(NULL);
        }
    }
    return(ret);
}